

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O1

void __thiscall
QGraphicsWidget::setAttribute(QGraphicsWidget *this,WidgetAttribute attribute,bool on)

{
  bool bVar1;
  ushort uVar2;
  byte bVar3;
  ushort uVar4;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = 0xff;
  bVar1 = true;
  if ((int)attribute < 0x37) {
    if ((int)attribute < 0x24) {
      if (attribute == WA_OpaquePaintEvent) {
        bVar3 = 6;
      }
      else {
        if (attribute != WA_NoSystemBackground) goto LAB_00649478;
        bVar3 = 5;
      }
    }
    else if (attribute == WA_SetPalette) {
      bVar3 = 7;
    }
    else if (attribute == WA_SetFont) {
      bVar3 = 8;
    }
    else {
      if (attribute != WA_Resized) goto LAB_00649478;
      bVar3 = 3;
    }
  }
  else if ((int)attribute < 0x39) {
    if (attribute == WA_DeleteOnClose) {
      bVar3 = 4;
    }
    else {
      if (attribute != WA_RightToLeft) goto LAB_00649478;
      bVar3 = 1;
    }
  }
  else if (attribute == WA_SetStyle) {
    bVar3 = 2;
  }
  else {
    if (attribute != WA_WindowPropagation) {
      if (attribute == WA_SetLayoutDirection) {
        bVar1 = false;
        bVar3 = 0;
      }
      goto LAB_00649478;
    }
    bVar3 = 9;
  }
  bVar1 = false;
LAB_00649478:
  if (bVar1) {
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,"QGraphicsWidget::setAttribute: unsupported attribute %d",attribute);
  }
  else {
    uVar4 = *(ushort *)(*(long *)(this + 0x18) + 0x1b4);
    uVar2 = (ushort)(1 << (bVar3 & 0x1f));
    if (on) {
      uVar4 = uVar4 | uVar2 & 0x3ff;
    }
    else {
      uVar4 = uVar4 & (~uVar2 | 0xfc00);
    }
    *(ushort *)(*(long *)(this + 0x18) + 0x1b4) = uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setAttribute(Qt::WidgetAttribute attribute, bool on)
{
    Q_D(QGraphicsWidget);
    // ### most flags require some immediate action
    // ### we might want to qWarn use of unsupported attributes
    // ### we might want to not use Qt::WidgetAttribute, but roll our own instead
    d->setAttribute(attribute, on);
}